

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loslib.cpp
# Opt level: O3

int getfield(lua_State *L,char *key,int d)

{
  int iVar1;
  lua_Integer lVar2;
  
  lua_getfield(L,-1,key);
  iVar1 = lua_isnumber(L,-1);
  if (iVar1 == 0) {
    if (d < 0) {
      iVar1 = luaL_error(L,"field \'%s\' missing in date table",key);
      return iVar1;
    }
  }
  else {
    lVar2 = lua_tointeger(L,-1);
    d = (int)lVar2;
  }
  lua_settop(L,-2);
  return d;
}

Assistant:

static int getfield (lua_State *L, const char *key, int d) {
  int res;
  lua_getfield(L, -1, key);
  if (lua_isnumber(L, -1))
    res = (int)lua_tointeger(L, -1);
  else {
    if (d < 0)
      return luaL_error(L, "field " LUA_QS " missing in date table", key);
    res = d;
  }
  lua_pop(L, 1);
  return res;
}